

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

ISEParams tcu::astc::anon_unknown_0::computeMaximumRangeISEParams
                    (int numAvailableBits,int numValuesInSequence)

{
  int iVar1;
  int local_58;
  int local_54;
  int local_50;
  ISEParams local_4c;
  ISEParams params_2;
  ISEParams params_1;
  ISEParams params;
  int maxRange;
  int plainBitRange;
  int quintRange;
  int tritRange;
  int curBitsForPlainBitMode;
  int curBitsForQuintMode;
  int curBitsForTritMode;
  int numValuesInSequence_local;
  int numAvailableBits_local;
  
  curBitsForPlainBitMode = 6;
  tritRange = 5;
  quintRange = 8;
  while( true ) {
    while( true ) {
      while( true ) {
        if (curBitsForPlainBitMode < 1) {
          local_50 = -1;
        }
        else {
          local_50 = (3 << ((byte)curBitsForPlainBitMode & 0x1f)) + -1;
        }
        if (tritRange < 1) {
          local_54 = -1;
        }
        else {
          local_54 = (5 << ((byte)tritRange & 0x1f)) + -1;
        }
        if (quintRange < 1) {
          local_58 = -1;
        }
        else {
          local_58 = (1 << ((byte)quintRange & 0x1f)) + -1;
        }
        iVar1 = de::max<int>(local_50,local_54);
        iVar1 = de::max<int>(iVar1,local_58);
        if (iVar1 != local_50) break;
        ISEParams::ISEParams(&params_1,ISEMODE_TRIT,curBitsForPlainBitMode);
        iVar1 = computeNumRequiredBits(&params_1,numValuesInSequence);
        if (iVar1 <= numAvailableBits) {
          ISEParams::ISEParams
                    ((ISEParams *)&numValuesInSequence_local,ISEMODE_TRIT,curBitsForPlainBitMode);
          return _numValuesInSequence_local;
        }
        curBitsForPlainBitMode = curBitsForPlainBitMode + -1;
      }
      if (iVar1 == local_54) break;
      ISEParams::ISEParams(&local_4c,ISEMODE_PLAIN_BIT,quintRange);
      iVar1 = computeNumRequiredBits(&local_4c,numValuesInSequence);
      if (iVar1 <= numAvailableBits) {
        ISEParams::ISEParams((ISEParams *)&numValuesInSequence_local,ISEMODE_PLAIN_BIT,quintRange);
        return _numValuesInSequence_local;
      }
      quintRange = quintRange + -1;
    }
    ISEParams::ISEParams(&params_2,ISEMODE_QUINT,tritRange);
    iVar1 = computeNumRequiredBits(&params_2,numValuesInSequence);
    if (iVar1 <= numAvailableBits) break;
    tritRange = tritRange + -1;
  }
  ISEParams::ISEParams((ISEParams *)&numValuesInSequence_local,ISEMODE_QUINT,tritRange);
  return _numValuesInSequence_local;
}

Assistant:

ISEParams computeMaximumRangeISEParams (int numAvailableBits, int numValuesInSequence)
{
	int curBitsForTritMode		= 6;
	int curBitsForQuintMode		= 5;
	int curBitsForPlainBitMode	= 8;

	while (true)
	{
		DE_ASSERT(curBitsForTritMode > 0 || curBitsForQuintMode > 0 || curBitsForPlainBitMode > 0);

		const int tritRange			= curBitsForTritMode > 0		? (3 << curBitsForTritMode) - 1			: -1;
		const int quintRange		= curBitsForQuintMode > 0		? (5 << curBitsForQuintMode) - 1		: -1;
		const int plainBitRange		= curBitsForPlainBitMode > 0	? (1 << curBitsForPlainBitMode) - 1		: -1;
		const int maxRange			= de::max(de::max(tritRange, quintRange), plainBitRange);

		if (maxRange == tritRange)
		{
			const ISEParams params(ISEMODE_TRIT, curBitsForTritMode);
			if (computeNumRequiredBits(params, numValuesInSequence) <= numAvailableBits)
				return ISEParams(ISEMODE_TRIT, curBitsForTritMode);
			curBitsForTritMode--;
		}
		else if (maxRange == quintRange)
		{
			const ISEParams params(ISEMODE_QUINT, curBitsForQuintMode);
			if (computeNumRequiredBits(params, numValuesInSequence) <= numAvailableBits)
				return ISEParams(ISEMODE_QUINT, curBitsForQuintMode);
			curBitsForQuintMode--;
		}
		else
		{
			const ISEParams params(ISEMODE_PLAIN_BIT, curBitsForPlainBitMode);
			DE_ASSERT(maxRange == plainBitRange);
			if (computeNumRequiredBits(params, numValuesInSequence) <= numAvailableBits)
				return ISEParams(ISEMODE_PLAIN_BIT, curBitsForPlainBitMode);
			curBitsForPlainBitMode--;
		}
	}
}